

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_sublist(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int in_root_set;
  vm_obj_id_t obj_00;
  size_t sVar4;
  uint *in_RCX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_obj_id_t obj;
  int32_t new_cnt;
  int32_t len;
  int32_t start;
  int32_t old_cnt;
  uint argc;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar5;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int32_t iVar7;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_RCX == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *in_RCX;
  }
  uVar6 = uVar5;
  if ((getp_sublist(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_sublist(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_sublist::desc,1,1);
    __cxa_guard_release(&getp_sublist(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (CVmNativeCodeDesc *)CONCAT44(uVar6,in_stack_ffffffffffffffa8));
  if (iVar1 == 0) {
    sVar4 = vmb_get_len((char *)0x318659);
    iVar3 = (int32_t)sVar4;
    iVar2 = CVmBif::pop_long_val();
    if (iVar2 < 0) {
      iVar2 = iVar3 + 1 + iVar2;
    }
    iVar1 = iVar3;
    if (1 < uVar5) {
      iVar3 = CVmBif::pop_long_val();
    }
    iVar7 = iVar3;
    CVmStack::push(in_RSI);
    if ((iVar2 < 1) || (iVar1 < iVar2)) {
      in_root_set = 0;
    }
    else {
      in_root_set = iVar1 - (iVar2 + -1);
    }
    if (iVar7 < 0) {
      in_root_set = iVar7 + in_root_set;
    }
    else if (iVar7 < in_root_set) {
      in_root_set = iVar7;
    }
    if (in_root_set < 0) {
      in_root_set = 0;
    }
    obj_00 = create(in_root_set,CONCAT44(uVar6,iVar3));
    vm_objp(0);
    cons_copy_data((CVmObjList *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),CONCAT44(iVar2,iVar7),
                   (char *)CONCAT44(in_root_set,obj_00),CONCAT44(uVar6,iVar3));
    vm_val_t::set_obj(in_RDI,obj_00);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjList::getp_sublist(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                             const char *lst, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the original element count */
    int32_t old_cnt = vmb_get_len(lst);

    /* pop the starting index; negative counts from the end of the list */
    int32_t start = CVmBif::pop_long_val(vmg0_);
    if (start < 0)
        start += old_cnt + 1;
    
    /* 
     *   pop the length, if present; if not, use the current element
     *   count, which will ensure that we use all available elements of
     *   the sublist 
     */
    int32_t len = (argc >= 2 ? CVmBif::pop_long_val(vmg0_) : old_cnt);

    /* push the 'self' as protection from GC */
    G_stk->push(self_val);

    /* skip to the first element */
    lst += VMB_LEN;

    /* skip to the desired first element */
    int32_t new_cnt;
    if (start >= 1 && start <= old_cnt)
    {
        /* it's in range - skip to the desired first element */
        lst += (start - 1) * VMB_DATAHOLDER;
        new_cnt = old_cnt - (start - 1);
    }
    else
    {
        /* there's nothing left */
        new_cnt = 0;
    }

    /* 
     *   limit the result to the desired new count, if it's shorter than
     *   what we have left (we obviously can't give them more elements
     *   than we have remaining) 
     */
    if (len < 0)
        new_cnt += len;
    else if (len < new_cnt)
        new_cnt = len;

    /* make sure the new length is non-negative */
    if (new_cnt < 0)
        new_cnt = 0;

    /* create the new list */
    vm_obj_id_t obj = create(vmg_ FALSE, new_cnt);

    /* copy the elements */
    ((CVmObjList *)vm_objp(vmg_ obj))->cons_copy_data(0, lst, new_cnt);

    /* return the new object */
    retval->set_obj(obj);

    /* discard GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}